

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::Init(SQSharedState *this)

{
  sqvector<SQObjectPtr> *psVar1;
  SQStringTable *pSVar2;
  SQObjectPtrVec *pSVar3;
  SQTable *pSVar4;
  SQString *pSVar5;
  SQObjectPtr *pSVar6;
  SQUnsignedInteger SVar7;
  SQObjectPtr local_350;
  SQObjectPtr local_340;
  SQObjectPtr local_330;
  SQObjectPtr local_320;
  SQObjectPtr local_310;
  SQObjectPtr local_300;
  SQObjectPtr local_2f0;
  SQObjectPtr local_2e0;
  SQObjectPtr local_2d0;
  SQObjectPtr local_2c0;
  SQObjectPtr local_2b0;
  SQObjectPtr local_2a0;
  SQObjectPtr local_290;
  SQObjectPtr local_280;
  SQObjectPtr local_270;
  SQObjectPtr local_260;
  SQObjectPtr local_250;
  SQObjectPtr local_240;
  SQObjectPtr local_230;
  SQObjectPtr local_220;
  SQObjectPtr local_210;
  SQObjectPtr local_200;
  SQObjectPtr local_1f0;
  SQObjectPtr local_1e0;
  SQObjectPtr local_1d0;
  SQObjectPtr local_1c0;
  SQObjectPtr local_1b0;
  SQObjectPtr local_1a0;
  SQObjectPtr local_190;
  SQObjectPtr local_180;
  SQObjectPtr local_170;
  SQObjectPtr local_160;
  SQObjectPtr local_150;
  SQObjectPtr local_140;
  SQObjectPtr local_130;
  SQObjectPtr local_120;
  SQObjectPtr local_110;
  SQObjectPtr local_100;
  SQObjectPtr local_f0;
  SQObjectPtr local_e0;
  SQObjectPtr local_d0;
  SQObjectPtr local_c0;
  SQObjectPtr local_b0;
  SQObjectPtr local_a0;
  SQObjectPtr local_90;
  SQObjectPtr local_80;
  SQObjectPtr local_70;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40 [2];
  SQObjectPtr local_20;
  SQSharedState *local_10;
  SQSharedState *this_local;
  
  this->_scratchpad = (SQChar *)0x0;
  this->_scratchpadsize = 0;
  this->_gc_chain = (SQCollectable_conflict *)0x0;
  local_10 = this;
  pSVar2 = (SQStringTable *)sq_vm_malloc(0x20);
  this->_stringtable = pSVar2;
  SQStringTable::SQStringTable(this->_stringtable,this);
  pSVar3 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_metamethods = pSVar3;
  sqvector<SQObjectPtr>::sqvector(this->_metamethods);
  pSVar3 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_systemstrings = pSVar3;
  sqvector<SQObjectPtr>::sqvector(this->_systemstrings);
  pSVar3 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_types = pSVar3;
  sqvector<SQObjectPtr>::sqvector(this->_types);
  pSVar4 = SQTable::Create(this,0x11);
  ::SQObjectPtr::operator=(&this->_metamethodsmap,pSVar4);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"null",-1);
  ::SQObjectPtr::SQObjectPtr(&local_20,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_20);
  ::SQObjectPtr::~SQObjectPtr(&local_20);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"table",-1);
  ::SQObjectPtr::SQObjectPtr(local_40,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,local_40);
  ::SQObjectPtr::~SQObjectPtr(local_40);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"array",-1);
  ::SQObjectPtr::SQObjectPtr(&local_50,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_50);
  ::SQObjectPtr::~SQObjectPtr(&local_50);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"closure",-1);
  ::SQObjectPtr::SQObjectPtr(&local_60,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_60);
  ::SQObjectPtr::~SQObjectPtr(&local_60);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"string",-1);
  ::SQObjectPtr::SQObjectPtr(&local_70,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_70);
  ::SQObjectPtr::~SQObjectPtr(&local_70);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"userdata",-1);
  ::SQObjectPtr::SQObjectPtr(&local_80,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_80);
  ::SQObjectPtr::~SQObjectPtr(&local_80);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"integer",-1);
  ::SQObjectPtr::SQObjectPtr(&local_90,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_90);
  ::SQObjectPtr::~SQObjectPtr(&local_90);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"float",-1);
  ::SQObjectPtr::SQObjectPtr(&local_a0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_a0);
  ::SQObjectPtr::~SQObjectPtr(&local_a0);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"userpointer",-1);
  ::SQObjectPtr::SQObjectPtr(&local_b0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_b0);
  ::SQObjectPtr::~SQObjectPtr(&local_b0);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"function",-1);
  ::SQObjectPtr::SQObjectPtr(&local_c0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_c0);
  ::SQObjectPtr::~SQObjectPtr(&local_c0);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"generator",-1);
  ::SQObjectPtr::SQObjectPtr(&local_d0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_d0);
  ::SQObjectPtr::~SQObjectPtr(&local_d0);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"thread",-1);
  ::SQObjectPtr::SQObjectPtr(&local_e0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_e0);
  ::SQObjectPtr::~SQObjectPtr(&local_e0);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"class",-1);
  ::SQObjectPtr::SQObjectPtr(&local_f0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_f0);
  ::SQObjectPtr::~SQObjectPtr(&local_f0);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"instance",-1);
  ::SQObjectPtr::SQObjectPtr(&local_100,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_100);
  ::SQObjectPtr::~SQObjectPtr(&local_100);
  psVar1 = this->_systemstrings;
  pSVar5 = SQString::Create(this,"bool",-1);
  ::SQObjectPtr::SQObjectPtr(&local_110,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_110);
  ::SQObjectPtr::~SQObjectPtr(&local_110);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_add",-1);
  ::SQObjectPtr::SQObjectPtr(&local_120,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_120);
  ::SQObjectPtr::~SQObjectPtr(&local_120);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_130,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_130);
  ::SQObjectPtr::~SQObjectPtr(&local_130);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_sub",-1);
  ::SQObjectPtr::SQObjectPtr(&local_140,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_140);
  ::SQObjectPtr::~SQObjectPtr(&local_140);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_150,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_150);
  ::SQObjectPtr::~SQObjectPtr(&local_150);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_mul",-1);
  ::SQObjectPtr::SQObjectPtr(&local_160,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_160);
  ::SQObjectPtr::~SQObjectPtr(&local_160);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_170,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_170);
  ::SQObjectPtr::~SQObjectPtr(&local_170);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_div",-1);
  ::SQObjectPtr::SQObjectPtr(&local_180,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_180);
  ::SQObjectPtr::~SQObjectPtr(&local_180);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_190,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_190);
  ::SQObjectPtr::~SQObjectPtr(&local_190);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_unm",-1);
  ::SQObjectPtr::SQObjectPtr(&local_1a0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_1a0);
  ::SQObjectPtr::~SQObjectPtr(&local_1a0);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_1b0,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_1b0);
  ::SQObjectPtr::~SQObjectPtr(&local_1b0);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_modulo",-1);
  ::SQObjectPtr::SQObjectPtr(&local_1c0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_1c0);
  ::SQObjectPtr::~SQObjectPtr(&local_1c0);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_1d0,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_1d0);
  ::SQObjectPtr::~SQObjectPtr(&local_1d0);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_set",-1);
  ::SQObjectPtr::SQObjectPtr(&local_1e0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_1e0);
  ::SQObjectPtr::~SQObjectPtr(&local_1e0);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_1f0,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_1f0);
  ::SQObjectPtr::~SQObjectPtr(&local_1f0);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_get",-1);
  ::SQObjectPtr::SQObjectPtr(&local_200,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_200);
  ::SQObjectPtr::~SQObjectPtr(&local_200);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_210,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_210);
  ::SQObjectPtr::~SQObjectPtr(&local_210);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_typeof",-1);
  ::SQObjectPtr::SQObjectPtr(&local_220,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_220);
  ::SQObjectPtr::~SQObjectPtr(&local_220);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_230,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_230);
  ::SQObjectPtr::~SQObjectPtr(&local_230);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_nexti",-1);
  ::SQObjectPtr::SQObjectPtr(&local_240,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_240);
  ::SQObjectPtr::~SQObjectPtr(&local_240);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_250,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_250);
  ::SQObjectPtr::~SQObjectPtr(&local_250);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_cmp",-1);
  ::SQObjectPtr::SQObjectPtr(&local_260,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_260);
  ::SQObjectPtr::~SQObjectPtr(&local_260);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_270,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_270);
  ::SQObjectPtr::~SQObjectPtr(&local_270);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_call",-1);
  ::SQObjectPtr::SQObjectPtr(&local_280,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_280);
  ::SQObjectPtr::~SQObjectPtr(&local_280);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_290,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_290);
  ::SQObjectPtr::~SQObjectPtr(&local_290);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_cloned",-1);
  ::SQObjectPtr::SQObjectPtr(&local_2a0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_2a0);
  ::SQObjectPtr::~SQObjectPtr(&local_2a0);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_2b0,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_2b0);
  ::SQObjectPtr::~SQObjectPtr(&local_2b0);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_newslot",-1);
  ::SQObjectPtr::SQObjectPtr(&local_2c0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_2c0);
  ::SQObjectPtr::~SQObjectPtr(&local_2c0);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_2d0,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_2d0);
  ::SQObjectPtr::~SQObjectPtr(&local_2d0);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_delslot",-1);
  ::SQObjectPtr::SQObjectPtr(&local_2e0,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_2e0);
  ::SQObjectPtr::~SQObjectPtr(&local_2e0);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_2f0,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_2f0);
  ::SQObjectPtr::~SQObjectPtr(&local_2f0);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_tostring",-1);
  ::SQObjectPtr::SQObjectPtr(&local_300,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_300);
  ::SQObjectPtr::~SQObjectPtr(&local_300);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_310,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_310);
  ::SQObjectPtr::~SQObjectPtr(&local_310);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_newmember",-1);
  ::SQObjectPtr::SQObjectPtr(&local_320,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_320);
  ::SQObjectPtr::~SQObjectPtr(&local_320);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_330,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_330);
  ::SQObjectPtr::~SQObjectPtr(&local_330);
  psVar1 = this->_metamethods;
  pSVar5 = SQString::Create(this,"_inherited",-1);
  ::SQObjectPtr::SQObjectPtr(&local_340,pSVar5);
  sqvector<SQObjectPtr>::push_back(psVar1,&local_340);
  ::SQObjectPtr::~SQObjectPtr(&local_340);
  pSVar4 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  pSVar6 = sqvector<SQObjectPtr>::back(this->_metamethods);
  SVar7 = sqvector<SQObjectPtr>::size(this->_metamethods);
  ::SQObjectPtr::SQObjectPtr(&local_350,SVar7 - 1);
  SQTable::NewSlot(pSVar4,pSVar6,&local_350);
  ::SQObjectPtr::~SQObjectPtr(&local_350);
  pSVar5 = SQString::Create(this,"constructor",-1);
  ::SQObjectPtr::operator=(&this->_constructoridx,pSVar5);
  pSVar4 = SQTable::Create(this,0);
  ::SQObjectPtr::operator=(&this->_registry,pSVar4);
  pSVar4 = SQTable::Create(this,0);
  ::SQObjectPtr::operator=(&this->_consts,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_table_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_table_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_array_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_array_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_string_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_string_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_number_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_number_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_closure_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_closure_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_generator_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_generator_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_thread_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_thread_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_class_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_class_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_instance_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_instance_default_delegate,pSVar4);
  pSVar4 = CreateDefaultDelegate(this,_weakref_default_delegate_funcz);
  ::SQObjectPtr::operator=(&this->_weakref_default_delegate,pSVar4);
  return;
}

Assistant:

void SQSharedState::Init()
{
    _scratchpad=NULL;
    _scratchpadsize=0;
#ifndef NO_GARBAGE_COLLECTOR
    _gc_chain=NULL;
#endif
    _stringtable = (SQStringTable*)SQ_MALLOC(sizeof(SQStringTable));
    new (_stringtable) SQStringTable(this);
    sq_new(_metamethods,SQObjectPtrVec);
    sq_new(_systemstrings,SQObjectPtrVec);
    sq_new(_types,SQObjectPtrVec);
    _metamethodsmap = SQTable::Create(this,MT_LAST-1);
    //adding type strings to avoid memory trashing
    //types names
    newsysstring(_SC("null"));
    newsysstring(_SC("table"));
    newsysstring(_SC("array"));
    newsysstring(_SC("closure"));
    newsysstring(_SC("string"));
    newsysstring(_SC("userdata"));
    newsysstring(_SC("integer"));
    newsysstring(_SC("float"));
    newsysstring(_SC("userpointer"));
    newsysstring(_SC("function"));
    newsysstring(_SC("generator"));
    newsysstring(_SC("thread"));
    newsysstring(_SC("class"));
    newsysstring(_SC("instance"));
    newsysstring(_SC("bool"));
    //meta methods
    newmetamethod(MM_ADD);
    newmetamethod(MM_SUB);
    newmetamethod(MM_MUL);
    newmetamethod(MM_DIV);
    newmetamethod(MM_UNM);
    newmetamethod(MM_MODULO);
    newmetamethod(MM_SET);
    newmetamethod(MM_GET);
    newmetamethod(MM_TYPEOF);
    newmetamethod(MM_NEXTI);
    newmetamethod(MM_CMP);
    newmetamethod(MM_CALL);
    newmetamethod(MM_CLONED);
    newmetamethod(MM_NEWSLOT);
    newmetamethod(MM_DELSLOT);
    newmetamethod(MM_TOSTRING);
    newmetamethod(MM_NEWMEMBER);
    newmetamethod(MM_INHERITED);

    _constructoridx = SQString::Create(this,_SC("constructor"));
    _registry = SQTable::Create(this,0);
    _consts = SQTable::Create(this,0);
    _table_default_delegate = CreateDefaultDelegate(this,_table_default_delegate_funcz);
    _array_default_delegate = CreateDefaultDelegate(this,_array_default_delegate_funcz);
    _string_default_delegate = CreateDefaultDelegate(this,_string_default_delegate_funcz);
    _number_default_delegate = CreateDefaultDelegate(this,_number_default_delegate_funcz);
    _closure_default_delegate = CreateDefaultDelegate(this,_closure_default_delegate_funcz);
    _generator_default_delegate = CreateDefaultDelegate(this,_generator_default_delegate_funcz);
    _thread_default_delegate = CreateDefaultDelegate(this,_thread_default_delegate_funcz);
    _class_default_delegate = CreateDefaultDelegate(this,_class_default_delegate_funcz);
    _instance_default_delegate = CreateDefaultDelegate(this,_instance_default_delegate_funcz);
    _weakref_default_delegate = CreateDefaultDelegate(this,_weakref_default_delegate_funcz);
}